

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  Am_Style aAStack_38 [8];
  Am_Style local_30 [8];
  
  puVar1 = (undefined8 *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  d1 = (Am_Drawonable *)
       (**(code **)*puVar1)(puVar1,800,10,300,200,"","",1,0,local_30,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_30);
  (**(code **)(*(long *)d1 + 0xa0))();
  Am_Style::Am_Style(aAStack_38,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (**(code **)*puVar1)(puVar1,800,0xfa,300,200,"","",1,0,aAStack_38,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(aAStack_38);
  (**(code **)(*(long *)d2 + 0xa0))();
  test_single_clips();
  test_multi_clips();
  test_intersections();
  test_region_fns();
  test_drawonable_fns();
  test_clear_clipping();
  test_more_clear_clipping();
  printf("Hit RETURN to exit:");
  getchar();
  return 0;
}

Assistant:

int
main()
{
  Am_Drawonable *root = Am_Drawonable::Get_Root_Drawonable();

  d1 = root->Create(TESTCLIP_D1_LEFT, 10, 300, 200);
  d1->Flush_Output();

  d2 = root->Create(TESTCLIP_D1_LEFT, 250, 300, 200);
  d2->Flush_Output();

  test_single_clips();
  test_multi_clips();
  test_intersections();
  test_region_fns();
  test_drawonable_fns();
  test_clear_clipping();
  test_more_clear_clipping();

  ///
  ///  Exit
  ///
  printf("Hit RETURN to exit:");
  getchar();

  return 0;
}